

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Geometry.cpp
# Opt level: O2

void amrex::Geometry::ResetDefaultProbDomain(RealBox *rb)

{
  CoordSys *this;
  
  this = (CoordSys *)**(undefined8 **)(DAT_006e0238 + -8);
  *(Real *)(this + 1) = rb->xlo[0];
  this[1].offset[0] = rb->xlo[1];
  this[1].offset[1] = rb->xlo[2];
  this[1].offset[2] = rb->xhi[0];
  this[1].dx[0] = rb->xhi[1];
  this[1].dx[1] = rb->xhi[2];
  CoordSys::SetOffset(this,rb->xlo);
  return;
}

Assistant:

void
Geometry::ResetDefaultProbDomain (const RealBox& rb) noexcept
{
    Geometry* gg = AMReX::top()->getDefaultGeometry();
    gg->prob_domain.setLo(rb.lo());
    gg->prob_domain.setHi(rb.hi());
    gg->SetOffset(rb.lo());
}